

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void testing::Mock::UnregisterCallReaction(void *mock_obj)

{
  MutexLock l;
  GTestMutexLock local_18;
  key_type local_10;
  
  local_18.mutex_ = (MutexBase *)internal::g_gmock_mutex;
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  std::
  _Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::internal::CallReaction>,_std::_Select1st<std::pair<const_void_*const,_testing::internal::CallReaction>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
  ::erase((_Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::internal::CallReaction>,_std::_Select1st<std::pair<const_void_*const,_testing::internal::CallReaction>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
           *)(anonymous_namespace)::g_uninteresting_call_reaction,&local_10);
  internal::GTestMutexLock::~GTestMutexLock(&local_18);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  g_uninteresting_call_reaction.erase(mock_obj);
}